

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O0

void acked(quicly_loss_t *loss,uint64_t pn,size_t epoch)

{
  int iVar1;
  quicly_sent_packet_t *ack_delay_encoded;
  quicly_sentmap_iter_t *in_RDX;
  quicly_loss_t *in_RSI;
  quicly_loss_t *in_RDI;
  int unaff_retaddr;
  int64_t sent_at;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  int64_t in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  quicly_sentmap_event_t in_stack_ffffffffffffffe4;
  
  quicly_loss_init_sentmap_iter
            (in_RDI,(quicly_sentmap_iter_t *)in_RSI,(int64_t)in_RDX,in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffe0);
  while( true ) {
    ack_delay_encoded = quicly_sentmap_get((quicly_sentmap_iter_t *)0x12f071);
    if ((quicly_loss_t *)ack_delay_encoded->packet_number == in_RSI) {
      iVar1 = quicly_sentmap_update((quicly_sentmap_t *)in_RSI,in_RDX,in_stack_ffffffffffffffe4);
      _ok((int)(ulong)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",
          0x2d);
      quicly_loss_on_ack_received
                (in_RSI,(uint64_t)in_RDX,
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(uint64_t)ack_delay_encoded,
                 unaff_retaddr);
      return;
    }
    if (ack_delay_encoded->packet_number == 0xffffffffffffffff) break;
    quicly_sentmap_skip((quicly_sentmap_iter_t *)0x12f0b6);
  }
  __assert_fail("sent->packet_number != UINT64_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c"
                ,0x29,"void acked(quicly_loss_t *, uint64_t, size_t)");
}

Assistant:

static void acked(quicly_loss_t *loss, uint64_t pn, size_t epoch)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    quicly_loss_init_sentmap_iter(loss, &iter, now, quicly_spec_context.transport_params.max_ack_delay, 0);
    while ((sent = quicly_sentmap_get(&iter))->packet_number != pn) {
        assert(sent->packet_number != UINT64_MAX);
        quicly_sentmap_skip(&iter);
    }
    int64_t sent_at = sent->sent_at;
    ok(quicly_sentmap_update(&loss->sentmap, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);

    quicly_loss_on_ack_received(loss, pn, epoch, now, sent_at, 0, 1);
}